

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3_align.c
# Opt level: O0

pnode_t * append_word(s3wid_t w,pnode_t *prev_end,s3cipid_t *pred_ci,s3cipid_t *succ_ci)

{
  int iVar1;
  pnode_t *ppVar2;
  pnode_t *dst;
  int local_70;
  int local_6c;
  pnode_t *local_68;
  pnode_t *p;
  pnode_t *nodelist;
  pnode_t *node;
  int32 pron;
  int32 pronlen;
  int32 n;
  int32 m;
  int32 N;
  int32 M;
  int32 i;
  s3cipid_t *succ_ci_local;
  s3cipid_t *pred_ci_local;
  pnode_t *prev_end_local;
  pnode_t *ppStack_10;
  s3wid_t w_local;
  
  for (N = 0; -1 < pred_ci[N]; N = N + 1) {
  }
  if (N < 1) {
    local_6c = 1;
  }
  else {
    local_6c = N;
  }
  for (N = 0; -1 < succ_ci[N]; N = N + 1) {
  }
  if (N < 1) {
    local_70 = 1;
  }
  else {
    local_70 = N;
  }
  iVar1 = dict->word[w].pronlen;
  if (iVar1 == 1) {
    p = (pnode_t *)0x0;
    for (pronlen = 0; pronlen < local_6c; pronlen = pronlen + 1) {
      for (pron = 0; pron < local_70; pron = pron + 1) {
        ppVar2 = alloc_pnode(w,0,*dict->word[w].ciphone,pred_ci[pronlen],succ_ci[pron],
                             WORD_POSN_SINGLE);
        for (local_68 = prev_end; local_68 != (pnode_t *)0x0; local_68 = local_68->next) {
          if ((local_68->ci == ppVar2->lc) && ((local_68->rc < 0 || (local_68->rc == ppVar2->ci))))
          {
            link_pnodes(local_68,ppVar2);
          }
        }
        ppVar2->next = p;
        p = ppVar2;
      }
    }
    ppStack_10 = p;
  }
  else {
    p = (pnode_t *)0x0;
    for (pronlen = 0; pronlen < local_6c; pronlen = pronlen + 1) {
      ppVar2 = alloc_pnode(w,0,*dict->word[w].ciphone,pred_ci[pronlen],dict->word[w].ciphone[1],
                           WORD_POSN_BEGIN);
      for (local_68 = prev_end; local_68 != (pnode_t *)0x0; local_68 = local_68->next) {
        if ((local_68->ci == ppVar2->lc) && ((local_68->rc < 0 || (local_68->rc == ppVar2->ci)))) {
          link_pnodes(local_68,ppVar2);
        }
      }
      ppVar2->next = p;
      p = ppVar2;
    }
    for (node._4_4_ = 1; ppVar2 = p, node._4_4_ < iVar1 + -1; node._4_4_ = node._4_4_ + 1) {
      ppVar2 = alloc_pnode(w,node._4_4_,dict->word[w].ciphone[node._4_4_],
                           dict->word[w].ciphone[node._4_4_ + -1],
                           dict->word[w].ciphone[node._4_4_ + 1],WORD_POSN_INTERNAL);
      for (local_68 = p; local_68 != (pnode_t *)0x0; local_68 = local_68->next) {
        link_pnodes(local_68,ppVar2);
      }
      p = ppVar2;
    }
    p = (pnode_t *)0x0;
    for (pron = 0; pron < local_70; pron = pron + 1) {
      dst = alloc_pnode(w,node._4_4_,dict->word[w].ciphone[node._4_4_],
                        dict->word[w].ciphone[node._4_4_ + -1],succ_ci[pron],WORD_POSN_END);
      for (local_68 = ppVar2; local_68 != (pnode_t *)0x0; local_68 = local_68->next) {
        link_pnodes(local_68,dst);
      }
      dst->next = p;
      p = dst;
    }
    ppStack_10 = p;
  }
  return ppStack_10;
}

Assistant:

static pnode_t *
append_word(s3wid_t w,
            pnode_t * prev_end, s3cipid_t * pred_ci, s3cipid_t * succ_ci)
{
    int32 i, M, N, m, n, pronlen, pron;
    pnode_t *node, *nodelist, *p;

    for (i = 0; IS_S3CIPID(pred_ci[i]); i++);
    M = (i > 0) ? i : 1;        /* #predecessor CI phones */

    for (i = 0; IS_S3CIPID(succ_ci[i]); i++);
    N = (i > 0) ? i : 1;        /* #successor CI phones */

    if ((pronlen = dict->word[w].pronlen) == 1) {
        /* Single phone case; replicated MxN times for all possible contexts */
        nodelist = NULL;

        for (m = 0; m < M; m++) {
            for (n = 0; n < N; n++) {
                node = alloc_pnode(w, 0,
                                   dict->word[w].ciphone[0], pred_ci[m],
                                   succ_ci[n], WORD_POSN_SINGLE);
                /* Link to all predecessor nodes matching context requirements */
                for (p = prev_end; p; p = p->next) {
                    if ((p->ci == node->lc) &&
                        ((NOT_S3CIPID(p->rc)) || (p->rc == node->ci))) {
                        link_pnodes(p, node);
                    }
                }

                node->next = nodelist;
                nodelist = node;
            }
        }

        return nodelist;
    }

    /* Multi-phone case.  First phone, replicated M times */
    nodelist = NULL;
    for (m = 0; m < M; m++) {
        node = alloc_pnode(w, 0,
                           dict->word[w].ciphone[0],
                           pred_ci[m],
                           dict->word[w].ciphone[1], WORD_POSN_BEGIN);
        /* Link to predecessor node(s) matching context requirements */
        for (p = prev_end; p; p = p->next) {
            if ((p->ci == node->lc) &&
                ((NOT_S3CIPID(p->rc)) || (p->rc == node->ci))) {
                link_pnodes(p, node);
            }
        }
        node->next = nodelist;
        nodelist = node;
    }

    /* Intermediate phones */
    for (pron = 1; pron < pronlen - 1; pron++) {
        node = alloc_pnode(w, pron,
                           dict->word[w].ciphone[pron],
                           dict->word[w].ciphone[pron - 1],
                           dict->word[w].ciphone[pron + 1],
                           WORD_POSN_INTERNAL);
        for (p = nodelist; p; p = p->next)
            link_pnodes(p, node);
        nodelist = node;
    }

    /* Final phone, replicated N times */
    prev_end = nodelist;
    nodelist = NULL;
    for (n = 0; n < N; n++) {
        node = alloc_pnode(w, pron,
                           dict->word[w].ciphone[pron],
                           dict->word[w].ciphone[pron - 1],
                           succ_ci[n], WORD_POSN_END);
        for (p = prev_end; p; p = p->next)
            link_pnodes(p, node);
        node->next = nodelist;
        nodelist = node;
    }

    return nodelist;
}